

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O2

ExprNode * __thiscall Translator::visit(Translator *this,NotNode *notNode)

{
  int iVar1;
  undefined4 extraout_var;
  Label *this_00;
  Label *this_01;
  ESEQ *this_02;
  SEQ *this_03;
  MOVE *this_04;
  ExprNode *pEVar3;
  ExprNode *pEVar4;
  SEQ *this_05;
  CJUMP *this_06;
  undefined4 extraout_var_00;
  SEQ *this_07;
  LABEL *this_08;
  SEQ *this_09;
  MOVE *this_10;
  LABEL *this_11;
  undefined8 *puVar2;
  
  iVar1 = (*(this->currentFrame->super_Frame)._vptr_Frame[1])(this->currentFrame,0,1);
  puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  this_00 = (Label *)operator_new(0x10);
  Label::Label(this_00);
  this_01 = (Label *)operator_new(0x10);
  Label::Label(this_01);
  this_02 = (ESEQ *)operator_new(0x20);
  this_03 = (SEQ *)operator_new(0x20);
  this_04 = (MOVE *)operator_new(0x20);
  pEVar3 = (ExprNode *)(**(code **)*puVar2)(puVar2);
  pEVar4 = (ExprNode *)operator_new(0x10);
  CONST::CONST((CONST *)pEVar4,1);
  MOVE::MOVE(this_04,pEVar3,pEVar4);
  this_05 = (SEQ *)operator_new(0x20);
  this_06 = (CJUMP *)operator_new(0x30);
  iVar1 = (*(notNode->exp->super_StmtNode).super_ASTNode._vptr_ASTNode[4])();
  pEVar3 = (ExprNode *)operator_new(0x10);
  CONST::CONST((CONST *)pEVar3,0);
  CJUMP::CJUMP(this_06,3,(ExprNode *)CONCAT44(extraout_var_00,iVar1),pEVar3,this_00,this_01);
  this_07 = (SEQ *)operator_new(0x20);
  this_08 = (LABEL *)operator_new(0x18);
  LABEL::LABEL(this_08,this_01);
  this_09 = (SEQ *)operator_new(0x20);
  this_10 = (MOVE *)operator_new(0x20);
  pEVar3 = (ExprNode *)(**(code **)*puVar2)(puVar2);
  pEVar4 = (ExprNode *)operator_new(0x10);
  CONST::CONST((CONST *)pEVar4,0);
  MOVE::MOVE(this_10,pEVar3,pEVar4);
  this_11 = (LABEL *)operator_new(0x18);
  LABEL::LABEL(this_11,this_00);
  SEQ::SEQ(this_09,(StmNode *)this_10,(StmNode *)this_11);
  SEQ::SEQ(this_07,(StmNode *)this_08,(StmNode *)this_09);
  SEQ::SEQ(this_05,(StmNode *)this_06,(StmNode *)this_07);
  SEQ::SEQ(this_03,(StmNode *)this_04,(StmNode *)this_05);
  pEVar3 = (ExprNode *)(**(code **)*puVar2)(puVar2);
  ESEQ::ESEQ(this_02,(StmNode *)this_03,pEVar3);
  return &this_02->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(NotNode *notNode) {
    LocalAccess *tmp = this->currentFrame->addLocal(false, INT8_SIZE);
    Label *t = new Label();
    Label *f = new Label();
    return new ESEQ(new SEQ(new MOVE(tmp->accessCode(), new CONST(1)),
                            new SEQ(new CJUMP(EQ, notNode->getExp()->accept(this), new CONST(0), t, f),
                                    new SEQ(new LABEL(f),
                                            new SEQ(new MOVE(tmp->accessCode(), new CONST(0)),
                                                    new LABEL(t))))),
                    tmp->accessCode());
}